

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O2

void __thiscall
LTOnlineChannel::LTOnlineChannel(LTOnlineChannel *this,dataRefsLT ch,LTChannelType t,char *chName)

{
  char *pcVar1;
  
  LTChannel::LTChannel(&this->super_LTChannel,ch,t,chName);
  (this->super_LTChannel)._vptr_LTChannel = (_func_int **)&PTR__LTOnlineChannel_002bba48;
  this->pCurl = (CURL *)0x0;
  (this->requBody)._M_dataplus._M_p = (pointer)&(this->requBody).field_2;
  (this->requBody)._M_string_length = 0;
  (this->requBody).field_2._M_local_buf[0] = '\0';
  pcVar1 = (char *)malloc(0x4000);
  this->netData = pcVar1;
  this->netDataPos = 0;
  this->netDataSize = 0x4000;
  memset(this->curl_errtxt,0,0x100);
  this->httpResponse = 200;
  InitCurl(this);
  return;
}

Assistant:

LTOnlineChannel::LTOnlineChannel (dataRefsLT ch, LTChannelType t, const char* chName) :
LTChannel(ch, t, chName),
pCurl(NULL),
netData((char*)malloc(CURL_MAX_WRITE_SIZE)),      // initial buffer allocation
netDataPos(0), netDataSize(CURL_MAX_WRITE_SIZE),
curl_errtxt{0}, httpResponse(HTTP_OK)
{
    // initialize a CURL handle (sets invalid if it fails)
    InitCurl();
}